

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetScrollHereX(float center_x_ratio)

{
  ImGuiWindow *window;
  float fVar1;
  float fVar2;
  
  window = GImGui->CurrentWindow;
  fVar1 = (GImGui->Style).ItemSpacing.x;
  fVar2 = (window->DC).LastItemRect.Min.x - fVar1;
  SetScrollFromPosX(window,((((window->DC).LastItemRect.Max.x + fVar1) - fVar2) * center_x_ratio +
                           fVar2) - (window->Pos).x,center_x_ratio);
  fVar1 = (window->WindowPadding).x - fVar1;
  (window->ScrollTargetEdgeSnapDist).x = (float)(~-(uint)(fVar1 <= 0.0) & (uint)fVar1);
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_x = g.Style.ItemSpacing.x;
    float target_pos_x = ImLerp(window->DC.LastItemRect.Min.x - spacing_x, window->DC.LastItemRect.Max.x + spacing_x, center_x_ratio);
    SetScrollFromPosX(window, target_pos_x - window->Pos.x, center_x_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.x = ImMax(0.0f, window->WindowPadding.x - spacing_x);
}